

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateAttributeDecl(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlAttributePtr attr)

{
  int iVar1;
  xmlChar *pxVar2;
  void *pvVar3;
  long lVar4;
  int iVar5;
  xmlChar *str1;
  uint uVar6;
  char *msg;
  xmlEnumerationPtr tree;
  xmlEnumerationPtr pxVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  int nbId;
  xmlChar *elemPrefix;
  
  if (doc == (xmlDocPtr)0x0) {
    return 0;
  }
  if ((doc->intSubset == (_xmlDtd *)0x0) && (doc->extSubset == (_xmlDtd *)0x0)) {
    return 0;
  }
  if (attr == (xmlAttributePtr)0x0) {
    return 1;
  }
  iVar5 = 1;
  if ((attr->defaultValue != (xmlChar *)0x0) &&
     (iVar1 = xmlValidateAttributeValueInternal(doc,attr->atype,attr->defaultValue), iVar1 == 0)) {
    iVar5 = 0;
    xmlDoErrValid(ctxt,(xmlNodePtr)attr,XML_DTD_ATTRIBUTE_DEFAULT,2,attr->name,attr->elem,
                  (xmlChar *)0x0,0,"Syntax of default value for attribute %s of %s is not valid\n",
                  attr->name,attr->elem,0);
  }
  if (attr->atype != XML_ATTRIBUTE_ID) goto LAB_0015a215;
  iVar1 = iVar5;
  if ((attr->def & ~XML_ATTRIBUTE_NONE) != XML_ATTRIBUTE_REQUIRED) {
    iVar1 = 0;
    iVar5 = 0;
    xmlDoErrValid(ctxt,(xmlNodePtr)attr,XML_DTD_ID_FIXED,2,attr->name,attr->elem,(xmlChar *)0x0,0,
                  "ID attribute %s of %s is not valid must be #IMPLIED or #REQUIRED\n",attr->name,
                  attr->elem,0);
    if (attr->atype != XML_ATTRIBUTE_ID) goto LAB_0015a215;
  }
  pxVar2 = xmlSplitQName4(attr->elem,&elemPrefix);
  if (pxVar2 == (xmlChar *)0x0) {
    xmlVErrMemory(ctxt);
    return 0;
  }
  if (doc->intSubset == (_xmlDtd *)0x0) {
    nbId = 0;
LAB_0015a144:
    iVar5 = iVar1;
    if (doc->extSubset != (_xmlDtd *)0x0) {
      pvVar3 = xmlHashLookup2((xmlHashTablePtr)doc->extSubset->elements,pxVar2,elemPrefix);
      uVar6 = 0;
      if ((pvVar3 != (void *)0x0) && (lVar4 = *(long *)((long)pvVar3 + 0x58), lVar4 != 0)) {
        pxVar8 = (xmlChar *)0x0;
        do {
          uVar6 = (int)pxVar8 + (uint)(*(int *)(lVar4 + 0x50) == 2);
          pxVar8 = (xmlChar *)(ulong)uVar6;
          lVar4 = *(long *)(lVar4 + 0x48);
        } while (lVar4 != 0);
        if (1 < uVar6) {
          pxVar2 = attr->name;
          str1 = attr->elem;
          msg = "Element %s has %d ID attribute defined in the external subset : %s\n";
          pxVar9 = pxVar8;
          pxVar10 = pxVar2;
          goto LAB_0015a1fe;
        }
      }
      if (1 < (int)(uVar6 + nbId)) {
        pxVar2 = attr->name;
        str1 = attr->elem;
        msg = "Element %s has ID attributes defined in the internal and external subset : %s\n";
        pxVar8 = (xmlChar *)0x0;
        pxVar9 = pxVar2;
        pxVar10 = (xmlChar *)0x0;
        goto LAB_0015a1fe;
      }
    }
  }
  else {
    pvVar3 = xmlHashLookup2((xmlHashTablePtr)doc->intSubset->elements,pxVar2,elemPrefix);
    if (pvVar3 == (void *)0x0) {
      nbId = 0;
      if (doc->intSubset == (_xmlDtd *)0x0) goto LAB_0015a144;
      xmlHashScan3((xmlHashTablePtr)doc->intSubset->attributes,(xmlChar *)0x0,(xmlChar *)0x0,
                   attr->elem,xmlValidateAttributeIdCallback,&nbId);
      pxVar8 = (xmlChar *)(ulong)(uint)nbId;
    }
    else {
      pxVar8 = (xmlChar *)0x0;
      for (lVar4 = *(long *)((long)pvVar3 + 0x58); nbId = (int)pxVar8, lVar4 != 0;
          lVar4 = *(long *)(lVar4 + 0x48)) {
        pxVar8 = (xmlChar *)(ulong)(nbId + (uint)(*(int *)(lVar4 + 0x50) == 2));
      }
    }
    if ((int)pxVar8 < 2) goto LAB_0015a144;
    pxVar2 = attr->name;
    str1 = attr->elem;
    msg = "Element %s has %d ID attribute defined in the internal subset : %s\n";
    pxVar9 = pxVar8;
    pxVar10 = pxVar2;
LAB_0015a1fe:
    xmlDoErrValid(ctxt,(xmlNodePtr)attr,XML_DTD_ID_SUBSET,2,str1,pxVar2,(xmlChar *)0x0,(int)pxVar8,
                  msg,str1,pxVar9,pxVar10);
    iVar5 = 0;
  }
  (*xmlFree)(elemPrefix);
LAB_0015a215:
  if ((attr->defaultValue != (xmlChar *)0x0) &&
     (pxVar7 = attr->tree, pxVar7 != (xmlEnumerationPtr)0x0)) {
    do {
      iVar1 = xmlStrEqual(pxVar7->name,attr->defaultValue);
      if (iVar1 != 0) {
        return iVar5;
      }
      pxVar7 = pxVar7->next;
    } while (pxVar7 != (_xmlEnumeration *)0x0);
    iVar5 = 0;
    xmlDoErrValid(ctxt,(xmlNodePtr)attr,XML_DTD_ATTRIBUTE_VALUE,2,attr->defaultValue,attr->name,
                  attr->elem,0,
                  "Default value \"%s\" for attribute %s of %s is not among the enumerated set\n",
                  attr->defaultValue,attr->name,attr->elem);
  }
  return iVar5;
}

Assistant:

int
xmlValidateAttributeDecl(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                         xmlAttributePtr attr) {
    int ret = 1;
    int val;
    CHECK_DTD;
    if(attr == NULL) return(1);

    /* Attribute Default Legal */
    /* Enumeration */
    if (attr->defaultValue != NULL) {
	val = xmlValidateAttributeValueInternal(doc, attr->atype,
	                                        attr->defaultValue);
	if (val == 0) {
	    xmlErrValidNode(ctxt, (xmlNodePtr) attr, XML_DTD_ATTRIBUTE_DEFAULT,
	       "Syntax of default value for attribute %s of %s is not valid\n",
	           attr->name, attr->elem, NULL);
	}
        ret &= val;
    }

    /* ID Attribute Default */
    if ((attr->atype == XML_ATTRIBUTE_ID)&&
        (attr->def != XML_ATTRIBUTE_IMPLIED) &&
	(attr->def != XML_ATTRIBUTE_REQUIRED)) {
	xmlErrValidNode(ctxt, (xmlNodePtr) attr, XML_DTD_ID_FIXED,
          "ID attribute %s of %s is not valid must be #IMPLIED or #REQUIRED\n",
	       attr->name, attr->elem, NULL);
	ret = 0;
    }

    /* One ID per Element Type */
    if (attr->atype == XML_ATTRIBUTE_ID) {
        xmlElementPtr elem = NULL;
        const xmlChar *elemLocalName;
        xmlChar *elemPrefix;
        int nbId;

        elemLocalName = xmlSplitQName4(attr->elem, &elemPrefix);
        if (elemLocalName == NULL) {
            xmlVErrMemory(ctxt);
            return(0);
        }

	/* the trick is that we parse DtD as their own internal subset */
        if (doc->intSubset != NULL)
            elem = xmlHashLookup2(doc->intSubset->elements,
                                  elemLocalName, elemPrefix);
	if (elem != NULL) {
	    nbId = xmlScanIDAttributeDecl(ctxt, elem, 0);
	} else {
	    xmlAttributeTablePtr table;

	    /*
	     * The attribute may be declared in the internal subset and the
	     * element in the external subset.
	     */
	    nbId = 0;
	    if (doc->intSubset != NULL) {
		table = (xmlAttributeTablePtr) doc->intSubset->attributes;
		xmlHashScan3(table, NULL, NULL, attr->elem,
			     xmlValidateAttributeIdCallback, &nbId);
	    }
	}
	if (nbId > 1) {

	    xmlErrValidNodeNr(ctxt, (xmlNodePtr) attr, XML_DTD_ID_SUBSET,
       "Element %s has %d ID attribute defined in the internal subset : %s\n",
		   attr->elem, nbId, attr->name);
            ret = 0;
	} else if (doc->extSubset != NULL) {
	    int extId = 0;
	    elem = xmlHashLookup2(doc->extSubset->elements,
                                  elemLocalName, elemPrefix);
	    if (elem != NULL) {
		extId = xmlScanIDAttributeDecl(ctxt, elem, 0);
	    }
	    if (extId > 1) {
		xmlErrValidNodeNr(ctxt, (xmlNodePtr) attr, XML_DTD_ID_SUBSET,
       "Element %s has %d ID attribute defined in the external subset : %s\n",
		       attr->elem, extId, attr->name);
                ret = 0;
	    } else if (extId + nbId > 1) {
		xmlErrValidNode(ctxt, (xmlNodePtr) attr, XML_DTD_ID_SUBSET,
"Element %s has ID attributes defined in the internal and external subset : %s\n",
		       attr->elem, attr->name, NULL);
                ret = 0;
	    }
	}

        xmlFree(elemPrefix);
    }

    /* Validity Constraint: Enumeration */
    if ((attr->defaultValue != NULL) && (attr->tree != NULL)) {
        xmlEnumerationPtr tree = attr->tree;
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, attr->defaultValue)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    xmlErrValidNode(ctxt, (xmlNodePtr) attr, XML_DTD_ATTRIBUTE_VALUE,
"Default value \"%s\" for attribute %s of %s is not among the enumerated set\n",
		   attr->defaultValue, attr->name, attr->elem);
	    ret = 0;
	}
    }

    return(ret);
}